

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_char_dimensions(wins *wins_ar,int ar_len)

{
  Am_Drawonable *font_win;
  undefined4 uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  char the_char;
  long local_78;
  Am_Font_Family_Flag local_6c;
  wins *local_68;
  Am_Font local_60 [8];
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar3 = 0;
  local_58 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    local_58 = uVar3;
  }
  local_38 = local_58 << 6;
  iVar5 = 0;
  local_68 = wins_ar;
  for (; (int)uVar3 != 2; uVar3 = (ulong)((int)uVar3 + 1)) {
    local_78 = 0;
    lVar4 = 0;
    local_50 = uVar3;
    while (lVar4 != 3) {
      local_6c = test_font_variety::family_array[lVar4];
      local_78 = (long)(int)local_78;
      lVar2 = 0;
      local_48 = lVar4;
      while (lVar2 != 3) {
        local_40 = lVar2;
        Am_Font::Am_Font(local_60,local_6c,false,(int)uVar3 != 0,false,
                         test_char_dimensions::size_array[lVar2]);
        Am_Font::operator=((Am_Font *)&test_font,local_60);
        Am_Font::~Am_Font(local_60);
        the_char = "AbgXij8.-@`|"[local_78];
        test_string = &the_char;
        test_str_len = 1;
        for (lVar4 = 0; local_38 != lVar4; lVar4 = lVar4 + 0x40) {
          font_win = *(Am_Drawonable **)((long)&local_68->font_win + lVar4);
          update_font_numbers(font_win,false);
          uVar1 = (**(code **)(*(long *)font_win + 0xc0))(font_win,&test_font,(int)the_char);
          (**(code **)(*(long *)font_win + 0x170))
                    (font_win,&black,&the_char,1,&test_font,0xaf,iVar5,0,&Am_No_Style,0);
          (**(code **)(*(long *)font_win + 0x160))
                    (font_win,&black,&Am_No_Style,0xaf,iVar5,uVar1,test_string_height,0);
        }
        local_78 = local_78 + 1;
        iVar5 = iVar5 + test_string_height + 4;
        uVar3 = local_50;
        lVar2 = local_40 + 1;
      }
      lVar4 = local_48 + 1;
    }
  }
  uVar3 = local_58 & 0xffffffff;
  for (lVar4 = 0; uVar3 << 6 != lVar4; lVar4 = lVar4 + 0x40) {
    (**(code **)(**(long **)((long)&local_68->font_win + lVar4) + 0xa0))();
  }
  return;
}

Assistant:

void
test_char_dimensions(wins *wins_ar, int ar_len)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[3] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_VERY_LARGE};
  int n;
  int top = 0;
  static const char *char_list = "AbgXij8.-@`|";
  for (int ital = 0; ital < 2; ital++) {
    n = 0;
    for (int fam = 0; fam < 3; fam++) {
      for (int size = 0; size < 3; size++) {
        test_font =
            Am_Font(family_array[fam], false, ital, false, size_array[size]);
        char the_char = char_list[n++];
        test_string = &the_char;
        test_str_len = 1;
        for (int i = 0; i < ar_len; i++) {
          Am_Drawonable *font_win = wins_ar[i].font_win;
          update_font_numbers(font_win); // To get test_string_height
          int char_width = font_win->Get_Char_Width(test_font, the_char);
          font_win->Draw_Text(black, &the_char, 1, test_font, 175, top);
          font_win->Draw_Rectangle(black, Am_No_Style, 175, top, char_width,
                                   test_string_height);
        }
        top = top + test_string_height + 4;
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}